

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.cpp
# Opt level: O0

void __thiscall
xmrig::BaseTransform::transformUint64(BaseTransform *this,Document *doc,int key,uint64_t arg)

{
  BaseTransform *in_RCX;
  int in_EDX;
  unsigned_long in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  undefined7 in_stack_00000008;
  bool in_stack_0000000f;
  BaseTransform *in_stack_00000010;
  undefined4 in_stack_00000020;
  unsigned_long in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_EDX == 0x52) {
    set<unsigned_long>(in_RCX,(Document *)CONCAT44(0x52,in_stack_ffffffffffffffd8),in_RDI,
                       in_stack_ffffffffffffffc8);
  }
  else if (in_EDX == 0x72) {
    set<unsigned_long>(in_RCX,(Document *)CONCAT44(0x72,in_stack_ffffffffffffffd8),in_RDI,
                       in_stack_ffffffffffffffc8);
  }
  else if (in_EDX == 0x3eb) {
    set<unsigned_long>(in_RCX,(Document *)CONCAT44(0x3eb,in_stack_ffffffffffffffd8),in_RDI,
                       in_stack_ffffffffffffffc8);
  }
  else if (in_EDX == 0x3ef) {
    set<unsigned_long>(in_RCX,(Document *)CONCAT44(0x3ef,in_stack_ffffffffffffffd8),in_RDI,
                       in_stack_ffffffffffffffc8);
  }
  else if (in_EDX == 0x3fb) {
    add<unsigned_long>(this,doc,(char *)CONCAT44(key,in_stack_00000020),(char *)arg,
                       (unsigned_long)in_stack_00000010,in_stack_0000000f);
  }
  else if (in_EDX == 0x1004) {
    in_RDI[0xc] = '\x01';
    set<unsigned_long>(in_stack_00000010,(Document *)CONCAT17(in_stack_0000000f,in_stack_00000008),
                       unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void xmrig::BaseTransform::transformUint64(rapidjson::Document &doc, int key, uint64_t arg)
{
    switch (key) {
    case IConfig::RetriesKey: /* --retries */
        return set(doc, "retries", arg);

    case IConfig::RetryPauseKey: /* --retry-pause */
        return set(doc, "retry-pause", arg);

    case IConfig::DonateLevelKey: /* --donate-level */
        return set(doc, "donate-level", arg);

    case IConfig::HttpPort: /* --http-port */
        m_http = true;
        return set(doc, kHttp, "port", arg);

    case IConfig::PrintTimeKey: /* --print-time */
        return set(doc, "print-time", arg);

#   ifdef XMRIG_FEATURE_HTTP
    case IConfig::DaemonPollKey:  /* --daemon-poll-interval */
        return add(doc, kPools, "daemon-poll-interval", arg);
#   endif

    default:
        break;
    }
}